

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Writer.cpp
# Opt level: O1

void __thiscall OSTEI_HRR_Writer::WriteHRRFile(OSTEI_HRR_Writer *this,ostream *of,ostream *ofh)

{
  char *pcVar1;
  _Rb_tree_color _Var2;
  int iVar3;
  uint uVar4;
  OSTEI_GeneratorInfo *pOVar5;
  pointer pcVar6;
  OSTEI_HRR_Algorithm_Base *pOVar7;
  uint __val;
  int iVar8;
  uint uVar9;
  RRStepType RVar10;
  uint uVar11;
  ostream *poVar12;
  _Rb_tree_node_base *p_Var13;
  ulong uVar14;
  uint __len;
  string __str;
  string steptypestr_1;
  string steptypestr;
  HRRDoubletStepList brasteps;
  QAM finalam;
  HRRDoubletStepList ketsteps;
  stringstream prototype_ncartket;
  stringstream prototype;
  string local_628;
  OSTEI_HRR_Writer *local_608;
  DAMSet local_600;
  string local_5d0;
  _Type local_5b0;
  undefined1 *local_5a8;
  long local_5a0;
  undefined1 local_598 [8];
  undefined8 uStack_590;
  _Type local_588;
  undefined8 uStack_580;
  int local_570;
  int iStack_56c;
  uint *local_568;
  long local_560;
  uint local_558 [2];
  undefined4 uStack_550;
  undefined4 uStack_54c;
  string local_548;
  ostream *local_528;
  HRRDoubletStepList local_520;
  int local_508;
  int iStack_504;
  int iStack_500;
  int iStack_4fc;
  undefined1 *local_4f8 [2];
  undefined1 local_4e8 [16];
  HRRDoubletStepList local_4d8;
  uint *local_4c0;
  long local_4b8;
  uint local_4b0 [2];
  undefined4 uStack_4a8;
  undefined4 uStack_4a4;
  undefined1 *local_4a0;
  long local_498;
  undefined1 local_490 [8];
  undefined8 uStack_488;
  undefined1 local_480 [128];
  ios_base local_400 [264];
  undefined1 local_2f8 [8];
  _Alloc_hider local_2f0;
  char local_2e0 [16];
  undefined1 local_2d0 [8];
  _Alloc_hider local_2c8;
  char local_2b8 [16];
  undefined1 local_2a8 [8];
  _Alloc_hider local_2a0;
  char local_290 [16];
  undefined1 local_280 [8];
  _Alloc_hider local_278;
  char local_268 [16];
  undefined1 local_258 [8];
  _Alloc_hider local_250;
  char local_240 [16];
  undefined1 local_230 [8];
  _Alloc_hider local_228;
  char local_218 [16];
  undefined1 local_208 [8];
  _Alloc_hider local_200;
  char local_1f0 [16];
  undefined1 local_1e0 [8];
  _Alloc_hider local_1d8;
  char local_1c8 [16];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  pOVar5 = this->info_;
  local_508 = (pOVar5->super_GeneratorInfoBase).finalam_.qam._M_elems[0];
  iStack_504 = (pOVar5->super_GeneratorInfoBase).finalam_.qam._M_elems[1];
  iStack_500 = (pOVar5->super_GeneratorInfoBase).finalam_.qam._M_elems[2];
  iStack_4fc = (pOVar5->super_GeneratorInfoBase).finalam_.qam._M_elems[3];
  local_4f8[0] = local_4e8;
  pcVar6 = (pOVar5->super_GeneratorInfoBase).finalam_.tag._M_dataplus._M_p;
  local_608 = this;
  local_528 = ofh;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_4f8,pcVar6,
             pcVar6 + (pOVar5->super_GeneratorInfoBase).finalam_.tag._M_string_length);
  local_588[1] = iStack_504;
  local_588[0] = local_508;
  uStack_580 = 0;
  local_4a0 = local_490;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a0,"");
  local_5a8 = local_598;
  local_5b0[0] = local_588[0];
  local_5b0[1] = local_588[1];
  if (local_4a0 == local_490) {
    uStack_590 = uStack_488;
  }
  else {
    local_5a8 = local_4a0;
  }
  local_5a0 = local_498;
  local_498 = 0;
  local_490[0] = 0;
  local_588 = (_Type)CONCAT44(iStack_4fc,iStack_500);
  uStack_580 = 0;
  local_4c0 = local_4b0;
  local_4a0 = local_490;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,"");
  local_568 = local_558;
  local_570 = local_588[0];
  iStack_56c = local_588[1];
  if (local_4c0 == local_4b0) {
    uStack_550 = uStack_4a8;
    uStack_54c = uStack_4a4;
  }
  else {
    local_568 = local_4c0;
  }
  local_560 = local_4b8;
  local_4b8 = 0;
  local_4b0[0] = local_4b0[0] & 0xffffff00;
  pOVar7 = local_608->hrr_algo_;
  local_1e0._0_4_ = local_5b0[0];
  local_1e0._4_4_ = local_5b0[1];
  local_4c0 = local_4b0;
  local_1d8._M_p = local_1c8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1d8,local_5a8,local_5a8 + local_5a0);
  OSTEI_HRR_Algorithm_Base::GetBraSteps(&local_520,pOVar7,(DAM *)local_1e0);
  if (local_1d8._M_p != local_1c8) {
    operator_delete(local_1d8._M_p);
  }
  pOVar7 = local_608->hrr_algo_;
  local_208._4_4_ = iStack_56c;
  local_208._0_4_ = local_570;
  local_200._M_p = local_1f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_200,local_568,local_560 + (long)local_568);
  OSTEI_HRR_Algorithm_Base::GetKetSteps(&local_4d8,pOVar7,(DAM *)local_208);
  if (local_200._M_p != local_1f0) {
    operator_delete(local_200._M_p);
  }
  if (local_520.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_520.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pOVar7 = local_608->hrr_algo_;
    local_230._0_4_ = local_5b0[0];
    local_230._4_4_ = local_5b0[1];
    local_228._M_p = local_218;
    std::__cxx11::string::_M_construct<char*>((string *)&local_228,local_5a8,local_5a8 + local_5a0);
    RVar10 = OSTEI_HRR_Algorithm_Base::GetBraRRStep(pOVar7,(DAM *)local_230);
    if (local_228._M_p != local_218) {
      operator_delete(local_228._M_p);
    }
    RRStepTypeToStr_abi_cxx11_(&local_5d0,RVar10);
    std::__ostream_insert<char,std::char_traits<char>>
              (of,"//////////////////////////////////////////////\n",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>(of,"// BRA: ( ",10);
    local_1b8[0] = *(stringstream *)
                    ("spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789" + local_5b0[0]);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>(of,(char *)local_1b8,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
    local_1b8[0] = *(stringstream *)
                    ("spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789" + local_5b0[1]);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)local_1b8,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," |\n",3);
    std::__ostream_insert<char,std::char_traits<char>>(of,"// Steps: ",10);
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)of);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (of,"//////////////////////////////////////////////\n",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>(of,"\n",1);
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"void HRR_",9);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (local_1a8,local_5d0._M_dataplus._M_p,local_5d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"_",1);
    local_480[0] = *(stringstream *)
                    ("spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789" + local_5b0[0]);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_480,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"_",1);
    local_480[0] = (stringstream)
                   "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"[local_5b0[1]];
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_480,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"(",1);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"double * const restrict ",0x18);
    iVar8 = iStack_504;
    iVar3 = local_508;
    local_600._M_t._M_impl._0_8_ = &local_600._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
    ;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_600,"X_X","");
    HRRVarName((string *)local_480,iVar3,iVar8,(string *)&local_600);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (local_1a8,(char *)local_480._0_8_,local_480._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,",\n",2);
    if ((undefined1 *)local_480._0_8_ != local_480 + 0x10) {
      operator_delete((void *)local_480._0_8_);
    }
    if ((_Base_ptr *)local_600._M_t._M_impl._0_8_ !=
        &local_600._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)local_600._M_t._M_impl._0_8_);
    }
    pOVar7 = local_608->hrr_algo_;
    local_258._0_4_ = local_5b0[0];
    local_258._4_4_ = local_5b0[1];
    local_250._M_p = local_240;
    std::__cxx11::string::_M_construct<char*>((string *)&local_250,local_5a8,local_5a8 + local_5a0);
    OSTEI_HRR_Algorithm_Base::GetBraAMReq((DAMSet *)local_480,pOVar7,(DAM *)local_258);
    if (local_250._M_p != local_240) {
      operator_delete(local_250._M_p);
    }
    if ((_Rb_tree_node_base *)local_480._24_8_ != (_Rb_tree_node_base *)(local_480 + 8)) {
      p_Var13 = (_Rb_tree_node_base *)local_480._24_8_;
      do {
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            (local_1a8,indent5_abi_cxx11_._M_dataplus._M_p,
                             indent5_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,"double const * const restrict ",0x1e);
        _Var2 = p_Var13[1]._M_color;
        iVar3 = *(int *)&p_Var13[1].field_0x4;
        local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"X_X","");
        HRRVarName((string *)&local_600,_Var2,iVar3,&local_628);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,(char *)local_600._M_t._M_impl._0_8_,
                             local_600._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,",\n",2);
        if ((_Base_ptr *)local_600._M_t._M_impl._0_8_ !=
            &local_600._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)local_600._M_t._M_impl._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_628._M_dataplus._M_p != &local_628.field_2) {
          operator_delete(local_628._M_dataplus._M_p);
        }
        p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
      } while (p_Var13 != (_Rb_tree_node_base *)(local_480 + 8));
    }
    std::_Rb_tree<DAM,_DAM,_std::_Identity<DAM>,_std::less<DAM>,_std::allocator<DAM>_>::~_Rb_tree
              ((_Rb_tree<DAM,_DAM,_std::_Identity<DAM>,_std::less<DAM>,_std::allocator<DAM>_> *)
               local_480);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (local_1a8,indent5_abi_cxx11_._M_dataplus._M_p,
                         indent5_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,"const double hAB[3], const int ncart_ket)",0x29);
    local_588[0] = 0;
    local_588[1] = 0;
    do {
      std::__cxx11::stringstream::stringstream((stringstream *)local_480);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_480 + 0x10),"static void HRR_",0x10);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_480 + 0x10),local_5d0._M_dataplus._M_p,
                           local_5d0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"_",1);
      local_600._M_t._M_impl._0_1_ =
           *(string *)
            ("spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789" + local_5b0[0]);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_480 + 0x10),(char *)&local_600,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"_",1);
      local_600._M_t._M_impl._0_1_ =
           "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"[local_5b0[1]];
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)&local_600,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"_",1);
      uVar4 = *(uint *)(&DAT_0014a3e0 + (long)local_588 * 4);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,uVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"(",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_480 + 0x10),"double * const restrict ",0x18);
      iVar8 = iStack_504;
      iVar3 = local_508;
      local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"X_X","");
      HRRVarName((string *)&local_600,iVar3,iVar8,&local_628);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_480 + 0x10),(char *)local_600._M_t._M_impl._0_8_,
                           local_600._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,",\n",2);
      if ((_Base_ptr *)local_600._M_t._M_impl._0_8_ !=
          &local_600._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)local_600._M_t._M_impl._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_628._M_dataplus._M_p != &local_628.field_2) {
        operator_delete(local_628._M_dataplus._M_p);
      }
      pOVar7 = local_608->hrr_algo_;
      local_2d0._0_4_ = local_5b0[0];
      local_2d0._4_4_ = local_5b0[1];
      local_2c8._M_p = local_2b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2c8,local_5a8,local_5a8 + local_5a0);
      OSTEI_HRR_Algorithm_Base::GetBraAMReq(&local_600,pOVar7,(DAM *)local_2d0);
      p_Var13 = local_600._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (local_2c8._M_p != local_2b8) {
        operator_delete(local_2c8._M_p);
        p_Var13 = local_600._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      for (; (_Rb_tree_header *)p_Var13 != &local_600._M_t._M_impl.super__Rb_tree_header;
          p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(local_480 + 0x10),indent5_abi_cxx11_._M_dataplus._M_p,
                             indent5_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,"double const * const restrict ",0x1e);
        _Var2 = p_Var13[1]._M_color;
        iVar3 = *(int *)&p_Var13[1].field_0x4;
        local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"X_X","");
        HRRVarName(&local_628,_Var2,iVar3,&local_548);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,local_628._M_dataplus._M_p,local_628._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,",\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_628._M_dataplus._M_p != &local_628.field_2) {
          operator_delete(local_628._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_548._M_dataplus._M_p != &local_548.field_2) {
          operator_delete(local_548._M_dataplus._M_p);
        }
      }
      std::_Rb_tree<DAM,_DAM,_std::_Identity<DAM>,_std::less<DAM>,_std::allocator<DAM>_>::~_Rb_tree
                ((_Rb_tree<DAM,_DAM,_std::_Identity<DAM>,_std::less<DAM>,_std::allocator<DAM>_> *)
                 &local_600);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_480 + 0x10),indent5_abi_cxx11_._M_dataplus._M_p,
                           indent5_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"const double hAB[3])",0x14);
      std::__cxx11::stringbuf::str();
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          (of,(char *)local_600._M_t._M_impl._0_8_,
                           local_600._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
      if ((_Base_ptr *)local_600._M_t._M_impl._0_8_ !=
          &local_600._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)local_600._M_t._M_impl._0_8_);
      }
      std::__ostream_insert<char,std::char_traits<char>>(of,"{\n",2);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          (of,indent1_abi_cxx11_._M_dataplus._M_p,
                           indent1_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"int iket;\n",10);
      std::__ostream_insert<char,std::char_traits<char>>(of,"\n",1);
      local_600._M_t._M_impl._0_8_ =
           &local_600._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_600,"");
      __val = -uVar4;
      if (0 < (int)uVar4) {
        __val = uVar4;
      }
      __len = 1;
      if (9 < __val) {
        uVar14 = (ulong)__val;
        uVar9 = 4;
        do {
          __len = uVar9;
          uVar11 = (uint)uVar14;
          if (uVar11 < 100) {
            __len = __len - 2;
            goto LAB_0012420f;
          }
          if (uVar11 < 1000) {
            __len = __len - 1;
            goto LAB_0012420f;
          }
          if (uVar11 < 10000) goto LAB_0012420f;
          uVar14 = uVar14 / 10000;
          uVar9 = __len + 4;
        } while (99999 < uVar11);
        __len = __len + 1;
      }
LAB_0012420f:
      local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_628,(char)__len - (char)((int)uVar4 >> 0x1f))
      ;
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_628._M_dataplus._M_p + (uVar4 >> 0x1f),__len,__val);
      local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"X_X","");
      WriteBraSteps_(local_608,of,&local_520,(string *)&local_600,&local_628,&local_548);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_548._M_dataplus._M_p != &local_548.field_2) {
        operator_delete(local_548._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_628._M_dataplus._M_p != &local_628.field_2) {
        operator_delete(local_628._M_dataplus._M_p);
      }
      if ((_Base_ptr *)local_600._M_t._M_impl._0_8_ !=
          &local_600._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)local_600._M_t._M_impl._0_8_);
      }
      std::__ostream_insert<char,std::char_traits<char>>(of,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(of,"}\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(of,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(of,"\n",1);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_480);
      std::ios_base::~ios_base(local_400);
      local_588 = (_Type)((long)local_588 + 1);
    } while (local_588 != (_Type)0xf);
    std::__cxx11::stringbuf::str();
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (of,(char *)local_480._0_8_,local_480._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n{\n",3);
    if ((undefined1 *)local_480._0_8_ != local_480 + 0x10) {
      operator_delete((void *)local_480._0_8_);
    }
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (of,indent1_abi_cxx11_._M_dataplus._M_p,indent1_abi_cxx11_._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"int done_brastep = 0;\n",0x16);
    local_588[0] = 0;
    local_588[1] = 0;
    do {
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          (of,indent1_abi_cxx11_._M_dataplus._M_p,
                           indent1_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"if (ncart_ket == ",0x11);
      iVar3 = *(int *)(&DAT_0014a3e0 + (long)local_588 * 4);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,")\n",2);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          (of,indent1_abi_cxx11_._M_dataplus._M_p,
                           indent1_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"{\n",2);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          (of,indent1_abi_cxx11_._M_dataplus._M_p,
                           indent1_abi_cxx11_._M_string_length);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,indent1_abi_cxx11_._M_dataplus._M_p,
                           indent1_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"HRR_",4);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,local_5d0._M_dataplus._M_p,local_5d0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"_",1);
      local_480[0] = *(stringstream *)
                      ("spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789" + local_5b0[0]
                      );
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_480,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"_",1);
      local_480[0] = (stringstream)
                     "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"[local_5b0[1]];
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>(of,local_480,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"_",1);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"(",1);
      iVar8 = iStack_504;
      iVar3 = local_508;
      local_600._M_t._M_impl._0_8_ =
           &local_600._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_600,"X_X","");
      HRRVarName((string *)local_480,iVar3,iVar8,(string *)&local_600);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          (of,(char *)local_480._0_8_,local_480._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,", ",2);
      if ((undefined1 *)local_480._0_8_ != local_480 + 0x10) {
        operator_delete((void *)local_480._0_8_);
      }
      if ((_Base_ptr *)local_600._M_t._M_impl._0_8_ !=
          &local_600._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)local_600._M_t._M_impl._0_8_);
      }
      pOVar7 = local_608->hrr_algo_;
      local_2f8._0_4_ = local_5b0[0];
      local_2f8._4_4_ = local_5b0[1];
      local_2f0._M_p = local_2e0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2f0,local_5a8,local_5a8 + local_5a0);
      OSTEI_HRR_Algorithm_Base::GetBraAMReq((DAMSet *)local_480,pOVar7,(DAM *)local_2f8);
      p_Var13 = (_Rb_tree_node_base *)local_480._24_8_;
      if (local_2f0._M_p != local_2e0) {
        operator_delete(local_2f0._M_p);
        p_Var13 = (_Rb_tree_node_base *)local_480._24_8_;
      }
      for (; p_Var13 != (_Rb_tree_node_base *)(local_480 + 8);
          p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
        _Var2 = p_Var13[1]._M_color;
        iVar3 = *(int *)&p_Var13[1].field_0x4;
        local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"X_X","");
        HRRVarName((string *)&local_600,_Var2,iVar3,&local_628);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            (of,(char *)local_600._M_t._M_impl._0_8_,
                             local_600._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,", ",2);
        if ((_Base_ptr *)local_600._M_t._M_impl._0_8_ !=
            &local_600._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)local_600._M_t._M_impl._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_628._M_dataplus._M_p != &local_628.field_2) {
          operator_delete(local_628._M_dataplus._M_p);
        }
      }
      std::_Rb_tree<DAM,_DAM,_std::_Identity<DAM>,_std::less<DAM>,_std::allocator<DAM>_>::~_Rb_tree
                ((_Rb_tree<DAM,_DAM,_std::_Identity<DAM>,_std::less<DAM>,_std::allocator<DAM>_> *)
                 local_480);
      std::__ostream_insert<char,std::char_traits<char>>(of,"hAB);\n",6);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          (of,indent1_abi_cxx11_._M_dataplus._M_p,
                           indent1_abi_cxx11_._M_string_length);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,indent1_abi_cxx11_._M_dataplus._M_p,
                           indent1_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"done_brastep = 1;\n",0x12);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          (of,indent1_abi_cxx11_._M_dataplus._M_p,
                           indent1_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"}\n\n",3);
      local_588 = (_Type)((long)local_588 + 1);
    } while (local_588 != (_Type)0xf);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (of,indent1_abi_cxx11_._M_dataplus._M_p,indent1_abi_cxx11_._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"if (done_brastep == 0) \n",0x18);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (of,indent1_abi_cxx11_._M_dataplus._M_p,indent1_abi_cxx11_._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"{\n",2);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (of,indent1_abi_cxx11_._M_dataplus._M_p,indent1_abi_cxx11_._M_string_length)
    ;
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12,indent1_abi_cxx11_._M_dataplus._M_p,
                         indent1_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"int iket;\n",10);
    std::__ostream_insert<char,std::char_traits<char>>(of,"\n",1);
    local_480._0_8_ = local_480 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"");
    local_600._M_t._M_impl._0_8_ = &local_600._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
    ;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_600,"ncart_ket","");
    local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"X_X","");
    WriteBraSteps_(local_608,of,&local_520,(string *)local_480,(string *)&local_600,&local_628);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_628._M_dataplus._M_p != &local_628.field_2) {
      operator_delete(local_628._M_dataplus._M_p);
    }
    if ((_Base_ptr *)local_600._M_t._M_impl._0_8_ !=
        &local_600._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)local_600._M_t._M_impl._0_8_);
    }
    if ((undefined1 *)local_480._0_8_ != local_480 + 0x10) {
      operator_delete((void *)local_480._0_8_);
    }
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (of,indent1_abi_cxx11_._M_dataplus._M_p,indent1_abi_cxx11_._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"}\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(of,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(of,"}\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(of,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(of,"\n",1);
    std::__cxx11::stringbuf::str();
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (local_528,(char *)local_480._0_8_,local_480._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,";\n\n",3);
    if ((undefined1 *)local_480._0_8_ != local_480 + 0x10) {
      operator_delete((void *)local_480._0_8_);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
      operator_delete(local_5d0._M_dataplus._M_p);
    }
  }
  if (local_4d8.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_4d8.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pOVar7 = local_608->hrr_algo_;
    local_280._4_4_ = iStack_56c;
    local_280._0_4_ = local_570;
    local_278._M_p = local_268;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_278,local_568,local_560 + (long)local_568);
    RVar10 = OSTEI_HRR_Algorithm_Base::GetKetRRStep(pOVar7,(DAM *)local_280);
    if (local_278._M_p != local_268) {
      operator_delete(local_278._M_p);
    }
    RRStepTypeToStr_abi_cxx11_((string *)&local_600,RVar10);
    std::__ostream_insert<char,std::char_traits<char>>
              (of,"//////////////////////////////////////////////\n",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>(of,"// KET: | ",10);
    local_1b8[0] = *(stringstream *)
                    ("spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789" + local_570);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>(of,(char *)local_1b8,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
    local_1b8[0] = *(stringstream *)
                    ("spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789" + iStack_56c);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)local_1b8,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," )\n",3);
    std::__ostream_insert<char,std::char_traits<char>>(of,"// Steps: ",10);
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)of);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (of,"//////////////////////////////////////////////\n",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>(of,"\n",1);
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"void HRR_",9);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (local_1a8,(char *)local_600._M_t._M_impl._0_8_,
                         local_600._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"_",1);
    local_480[0] = *(stringstream *)
                    ("spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789" + local_570);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_480,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"_",1);
    local_480[0] = (stringstream)
                   "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"[iStack_56c];
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_480,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"(",1);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"double * const restrict ",0x18);
    local_5d0._M_dataplus._M_p = (pointer)&local_5d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d0,"X_X","");
    HRRVarName((string *)local_480,&local_5d0,iStack_500,iStack_4fc);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (local_1a8,(char *)local_480._0_8_,local_480._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,",\n",2);
    if ((undefined1 *)local_480._0_8_ != local_480 + 0x10) {
      operator_delete((void *)local_480._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
      operator_delete(local_5d0._M_dataplus._M_p);
    }
    pOVar7 = local_608->hrr_algo_;
    local_2a8._4_4_ = iStack_56c;
    local_2a8._0_4_ = local_570;
    local_2a0._M_p = local_290;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a0,local_568,local_560 + (long)local_568);
    OSTEI_HRR_Algorithm_Base::GetKetAMReq((DAMSet *)local_480,pOVar7,(DAM *)local_2a8);
    if (local_2a0._M_p != local_290) {
      operator_delete(local_2a0._M_p);
    }
    if ((_Rb_tree_node_base *)local_480._24_8_ != (_Rb_tree_node_base *)(local_480 + 8)) {
      p_Var13 = (_Rb_tree_node_base *)local_480._24_8_;
      do {
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            (local_1a8,indent5_abi_cxx11_._M_dataplus._M_p,
                             indent5_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,"double const * const restrict ",0x1e);
        local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"X_X","");
        HRRVarName(&local_5d0,&local_628,p_Var13[1]._M_color,*(int *)&p_Var13[1].field_0x4);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,local_5d0._M_dataplus._M_p,local_5d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,",\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
          operator_delete(local_5d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_628._M_dataplus._M_p != &local_628.field_2) {
          operator_delete(local_628._M_dataplus._M_p);
        }
        p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
      } while (p_Var13 != (_Rb_tree_node_base *)(local_480 + 8));
    }
    std::_Rb_tree<DAM,_DAM,_std::_Identity<DAM>,_std::less<DAM>,_std::allocator<DAM>_>::~_Rb_tree
              ((_Rb_tree<DAM,_DAM,_std::_Identity<DAM>,_std::less<DAM>,_std::allocator<DAM>_> *)
               local_480);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (local_1a8,indent5_abi_cxx11_._M_dataplus._M_p,
                         indent5_abi_cxx11_._M_string_length);
    pcVar1 = local_480 + 0x10;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,"const double hCD[3], const int ncart_bra)",0x29);
    std::__cxx11::stringbuf::str();
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (of,(char *)local_480._0_8_,local_480._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
    if ((char *)local_480._0_8_ != pcVar1) {
      operator_delete((void *)local_480._0_8_);
    }
    std::__ostream_insert<char,std::char_traits<char>>(of,"{\n",2);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (of,indent1_abi_cxx11_._M_dataplus._M_p,indent1_abi_cxx11_._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"int ibra;\n",10);
    std::__ostream_insert<char,std::char_traits<char>>(of,"\n",1);
    local_480._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"");
    local_5d0._M_dataplus._M_p = (pointer)&local_5d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d0,"ncart_bra","");
    local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"X_X","");
    WriteKetSteps_(local_608,of,&local_4d8,(string *)local_480,&local_5d0,&local_628);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_628._M_dataplus._M_p != &local_628.field_2) {
      operator_delete(local_628._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
      operator_delete(local_5d0._M_dataplus._M_p);
    }
    if ((char *)local_480._0_8_ != pcVar1) {
      operator_delete((void *)local_480._0_8_);
    }
    std::__ostream_insert<char,std::char_traits<char>>(of,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(of,"}\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(of,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(of,"\n",1);
    std::__cxx11::stringbuf::str();
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (local_528,(char *)local_480._0_8_,local_480._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,";\n\n",3);
    if ((char *)local_480._0_8_ != pcVar1) {
      operator_delete((void *)local_480._0_8_);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
    if ((_Base_ptr *)local_600._M_t._M_impl._0_8_ !=
        &local_600._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)local_600._M_t._M_impl._0_8_);
    }
  }
  std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::~vector(&local_4d8);
  std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::~vector(&local_520);
  if (local_568 != local_558) {
    operator_delete(local_568);
  }
  if (local_5a8 != local_598) {
    operator_delete(local_5a8);
  }
  if (local_4f8[0] != local_4e8) {
    operator_delete(local_4f8[0]);
  }
  return;
}

Assistant:

void OSTEI_HRR_Writer::WriteHRRFile(std::ostream & of, std::ostream & ofh) const
{
    QAM finalam = info_.FinalAM();
    DAM braam = {finalam[0], finalam[1]};
    DAM ketam = {finalam[2], finalam[3]};

    // only call the function for the last doublets
    HRRDoubletStepList brasteps = hrr_algo_.GetBraSteps(braam);
    HRRDoubletStepList ketsteps = hrr_algo_.GetKetSteps(ketam);

    if(brasteps.size() > 0)
    {
        RRStepType brasteptype = hrr_algo_.GetBraRRStep(braam);
        std::string steptypestr = RRStepTypeToStr(brasteptype);

        of << "//////////////////////////////////////////////\n";
        of << "// BRA: ( " << amchar[braam[0]] << " " << amchar[braam[1]] << " |\n";
        of << "// Steps: " << brasteps.size() << "\n";
        of << "//////////////////////////////////////////////\n";
        of << "\n";

        std::stringstream prototype;
        

        prototype << "void HRR_" << steptypestr << "_";
        prototype << amchar[braam[0]] << "_" << amchar[braam[1]] << "(";

        // pointer to result buffer
        prototype << "double * const restrict " << HRRVarName(finalam[0], finalam[1], "X_X") << ",\n";

        // pointer to requirements
        for(const auto & it : hrr_algo_.GetBraAMReq(braam))
            prototype << indent5 << "double const * const restrict " << HRRVarName(it[0], it[1], "X_X") << ",\n";

        prototype << indent5 << "const double hAB[3], const int ncart_ket)";

        // Create different functions for different ncart_ket values
        const int ncart_ket_vals[15] = {1, 3, 6, 10, 15, 21, 28, 36, 45, 55, 66, 78, 91, 105, 120};
        for (int ival = 0; ival < 15; ival++)
        {
            std::stringstream prototype_ncartket;
            prototype_ncartket << "static void HRR_" << steptypestr << "_";
            prototype_ncartket << amchar[braam[0]] << "_" << amchar[braam[1]] << "_" << ncart_ket_vals[ival] << "(";

            // pointer to result buffer
            prototype_ncartket << "double * const restrict " << HRRVarName(finalam[0], finalam[1], "X_X") << ",\n";

            // pointer to requirements
            for(const auto & it : hrr_algo_.GetBraAMReq(braam))
                prototype_ncartket << indent5 << "double const * const restrict " << HRRVarName(it[0], it[1], "X_X") << ",\n";

            prototype_ncartket << indent5 << "const double hAB[3])";
            
            of << prototype_ncartket.str() << "\n";
            of << "{\n";
            of << indent1 << "int iket;\n";
            of << "\n";
            
            WriteBraSteps_(of, brasteps, "", std::to_string(ncart_ket_vals[ival]), "X_X"); 
            
            of << "\n";
            of << "}\n";
            of << "\n";
            of << "\n";
        }
        
        
        of << prototype.str() << "\n{\n";  // Original function header
        
        // Wrapper for different ncart_ket value functions
        of << indent1 << "int done_brastep = 0;\n";
        for (int ival = 0; ival < 15; ival++)
        {
            of << indent1 << "if (ncart_ket == " << ncart_ket_vals[ival] << ")\n";
            of << indent1 << "{\n";
            
            // function name
            of << indent1 << indent1 << "HRR_" << steptypestr << "_" << amchar[braam[0]] << "_";
            of << amchar[braam[1]] << "_" << ncart_ket_vals[ival] << "(";
            
            // pointer to result buffer
            of << HRRVarName(finalam[0], finalam[1], "X_X") << ", ";
            
            // pointer to requirements
            for(const auto & it : hrr_algo_.GetBraAMReq(braam))
                of << HRRVarName(it[0], it[1], "X_X") << ", ";
            of << "hAB);\n";
            
            of << indent1 << indent1 << "done_brastep = 1;\n";
            
            of << indent1 << "}\n\n";
        }
        
        
        // General situtaion
        of << indent1 << "if (done_brastep == 0) \n";
        of << indent1 << "{\n";
        
        of << indent1 << indent1 << "int iket;\n";
        of << "\n";
        
        WriteBraSteps_(of, brasteps, "", "ncart_ket", "X_X"); 
        
        of << indent1 << "}\n";

        of << "\n";
        of << "}\n";
        of << "\n";
        of << "\n";


        // header
        ofh << prototype.str() << ";\n\n";

    }

    if(ketsteps.size() > 0)
    {
        RRStepType ketsteptype = hrr_algo_.GetKetRRStep(ketam);
        std::string steptypestr = RRStepTypeToStr(ketsteptype);

        of << "//////////////////////////////////////////////\n";
        of << "// KET: | " << amchar[ketam[0]] << " " << amchar[ketam[1]] << " )\n";
        of << "// Steps: " << ketsteps.size() << "\n";
        of << "//////////////////////////////////////////////\n";
        of << "\n";

        std::stringstream prototype;

        prototype << "void HRR_" << steptypestr << "_";
        prototype << amchar[ketam[0]] << "_" << amchar[ketam[1]] << "(";

        // pointer to result buffer
        prototype << "double * const restrict " << HRRVarName("X_X", finalam[2], finalam[3]) << ",\n";

        // pointer to requirements
        for(const auto & it : hrr_algo_.GetKetAMReq(ketam))
            prototype << indent5 << "double const * const restrict " << HRRVarName("X_X", it[0], it[1]) << ",\n";

        prototype << indent5 << "const double hCD[3], const int ncart_bra)";



        of << prototype.str() << "\n";
        of << "{\n";
        of << indent1 << "int ibra;\n";
        of << "\n";

        WriteKetSteps_(of, ketsteps, "", "ncart_bra", "X_X"); 

        of << "\n";
        of << "}\n";
        of << "\n";
        of << "\n";


        // header
        ofh << prototype.str() << ";\n\n";
    }
}